

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O0

void __thiscall
JointPolicyPureVectorForClusteredBG::RecursivelyPrintPolicyForAgent
          (JointPolicyPureVectorForClusteredBG *this,PlanningUnitDecPOMDPDiscrete *pu,
          stringstream *ss,Index agI,Index ts,Index last_ts,Index aohI,Index ohI,TypeCluster *tc,
          Index tI,Index aI,
          vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
          *jpolBGVec,
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          *bgVec)

{
  const_reference ppJVar1;
  ulong uVar2;
  size_t sVar3;
  ostream *poVar4;
  uint in_ECX;
  PlanningUnitDecPOMDPDiscrete *in_RDX;
  PlanningUnitMADPDiscrete *in_RSI;
  int in_R8D;
  uint in_R9D;
  Index unaff_retaddr;
  Index in_stack_00000008;
  TypeCluster *in_stack_00000010;
  Index in_stack_00000018;
  Index in_stack_00000020;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  *in_stack_00000028;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  *in_stack_00000030;
  Index n_ts;
  Index n_aI;
  TypeCluster *n_tc;
  E *e;
  Index n_tI;
  Index n_ohI;
  Index n_aohI;
  Index obsI;
  shared_ptr<const_BayesianGameWithClusterInfo> bg;
  JointPolicyDiscretePure *jpolBG;
  Index in_stack_fffffffffffffdd8;
  Index in_stack_fffffffffffffddc;
  Index in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  Index IVar5;
  undefined4 in_stack_fffffffffffffdf4;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe18;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe2c;
  Index in_stack_fffffffffffffe38;
  Index in_stack_fffffffffffffe3c;
  BayesianGameWithClusterInfo *in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe48;
  Index in_stack_fffffffffffffe4c;
  ostream *in_stack_fffffffffffffe68;
  TypeCluster *in_stack_fffffffffffffe70;
  Index in_stack_fffffffffffffe7c;
  BayesianGameWithClusterInfo *in_stack_fffffffffffffe80;
  string local_100 [32];
  string local_e0;
  Index local_bc;
  BayesianGameWithClusterInfo *local_b8;
  Index local_88;
  Index local_84;
  Index local_80;
  uint local_6c;
  shared_ptr<const_BayesianGameWithClusterInfo> local_68;
  value_type pJVar6;
  Index in_stack_ffffffffffffffb0;
  uint uVar7;
  PlanningUnitDecPOMDPDiscrete *pu_00;
  PlanningUnitMADPDiscrete *this_00;
  
  ppJVar1 = std::
            vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
            ::at((vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                  *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  pJVar6 = *ppJVar1;
  std::
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  ::at((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
        *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
       CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (shared_ptr<const_BayesianGameWithClusterInfo> *)
             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  for (local_6c = 0; uVar2 = (ulong)local_6c,
      sVar3 = PlanningUnitMADPDiscrete::GetNrObservations
                        ((PlanningUnitMADPDiscrete *)
                         CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffddc), uVar2 < sVar3; local_6c = local_6c + 1) {
    local_80 = PlanningUnitMADPDiscrete::GetSuccessorAOHI
                         ((PlanningUnitMADPDiscrete *)
                          CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                          (Index)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                          (Index)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                          in_stack_fffffffffffffe38);
    local_84 = PlanningUnitMADPDiscrete::GetSuccessorOHI
                         ((PlanningUnitMADPDiscrete *)
                          CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                          (Index)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                          (Index)in_stack_fffffffffffffe20,
                          (Index)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    local_88 = 0;
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&local_68);
    local_88 = BayesianGameWithClusterInfo::FindTypeClusterIndex
                         (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                          in_stack_fffffffffffffe70,
                          (Index)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                          (Index)in_stack_fffffffffffffe68);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&local_68);
    in_stack_fffffffffffffe80 =
         (BayesianGameWithClusterInfo *)
         BayesianGameWithClusterInfo::GetTypeCluster
                   ((BayesianGameWithClusterInfo *)
                    CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                    in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8);
    local_b8 = in_stack_fffffffffffffe80;
    in_stack_fffffffffffffe7c =
         (*(pJVar6->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x13])
                   (pJVar6,(ulong)in_ECX,(ulong)local_88);
    in_stack_fffffffffffffe70 =
         (TypeCluster *)&(in_RDX->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_agentI;
    local_bc = in_stack_fffffffffffffe7c;
    PlanningUnitMADPDiscrete::SoftPrintObservationHistory_abi_cxx11_
              (&local_e0,in_RSI,in_ECX,local_84);
    in_stack_fffffffffffffe68 =
         std::operator<<((ostream *)in_stack_fffffffffffffe70,(string *)&local_e0);
    poVar4 = std::operator<<(in_stack_fffffffffffffe68," -> ");
    (*(in_RSI->super_PlanningUnit)._vptr_PlanningUnit[0xc])
              (local_100,in_RSI,(ulong)in_ECX,(ulong)local_bc);
    poVar4 = std::operator<<(poVar4,local_100);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    if (in_R8D + 1U <= in_R9D) {
      in_stack_fffffffffffffdd8 = local_80;
      in_stack_fffffffffffffde0 = local_84;
      in_stack_fffffffffffffe40 = local_b8;
      IVar5 = local_88;
      in_stack_fffffffffffffe4c = local_bc;
      uVar7 = in_ECX;
      pu_00 = in_RDX;
      this_00 = in_RSI;
      std::
      vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
      ::vector((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                *)CONCAT44(in_R9D,in_R8D + 1U),
               (vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                *)CONCAT44(in_ECX,in_stack_fffffffffffffe28));
      in_stack_fffffffffffffe38 = in_stack_fffffffffffffdd8;
      in_stack_fffffffffffffe3c = in_stack_fffffffffffffde0;
      in_stack_fffffffffffffe48 = IVar5;
      RecursivelyPrintPolicyForAgent
                ((JointPolicyPureVectorForClusteredBG *)this_00,pu_00,
                 (stringstream *)CONCAT44(uVar7,in_R8D),in_R9D,in_stack_ffffffffffffffb0,
                 (Index)((ulong)pJVar6 >> 0x20),unaff_retaddr,in_stack_00000008,in_stack_00000010,
                 in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030);
      std::
      vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
      ::~vector((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                 *)CONCAT44(in_stack_fffffffffffffdf4,IVar5));
      in_stack_fffffffffffffe18 = in_RSI;
      in_stack_fffffffffffffe20 = in_RDX;
      in_stack_fffffffffffffe2c = in_ECX;
      in_ECX = uVar7;
      in_RDX = pu_00;
      in_RSI = this_00;
    }
  }
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8ca7a8);
  return;
}

Assistant:

void
JointPolicyPureVectorForClusteredBG::RecursivelyPrintPolicyForAgent(
        const PlanningUnitDecPOMDPDiscrete* pu
        , stringstream& ss
        , Index agI
        , Index ts
        , Index last_ts
        , Index aohI    //the previous aohI
        , Index ohI    //the previous ohI
        , const TypeCluster* tc //the previous typecluster that represents aohI
        , Index tI //the index of tc (in the previous bg)
        , Index aI //the action taken for tI (i.e. for aohI)
        , const vector<const JointPolicyDiscretePure* >& jpolBGVec
        , vector<boost::shared_ptr<const BayesianGameWithClusterInfo> > bgVec
    )const 
{    
    //const JointPolicyPureVectorForClusteredBG* jpolBG = jpolBGVec.at(ts);
    const JointPolicyDiscretePure* jpolBG = jpolBGVec.at(ts);
    boost::shared_ptr<const BayesianGameWithClusterInfo> bg = bgVec.at(ts);

#if DEBUG_RECURSIVE_SPRINT
    cout << ">>>Starting RecurivelyPrintPolicyForAgent for " << endl;
    cout << "agI="<<agI<<endl;
    cout << "ts="<<ts<<endl;
    cout << "aohI="<<aohI<<endl;
    cout << "ohI="<<ohI<<endl;
    cout << "tI="<<tI<<endl;
    cout << "aI="<<aI<<endl;
    //cout << "BG: " << endl << bg->SoftPrint();
    cout << endl;
#endif
    Index obsI = 0;
    for(obsI=0; obsI < pu->GetNrObservations(agI); obsI++)
    {
        Index n_aohI = pu->GetSuccessorAOHI(agI, aohI, aI, obsI);
        Index n_ohI = pu->GetSuccessorOHI(agI, ohI, obsI);
        ///NOTE: this can throw an error if there is no type 
        //for the history (e.g. if the histories prob. is 0)
        Index n_tI = 0;
        try{
            n_tI = bg->FindTypeClusterIndex(agI, tc, aI, obsI);
        } catch (E& e) {
            ss << pu->SoftPrintObservationHistory(agI, n_ohI) << 
                " *CAN'T OCCUR* -> ANY "<< endl;
            continue;
        }
        
        const TypeCluster* n_tc =  bg->GetTypeCluster(agI, n_tI);
        Index n_aI = jpolBG->GetActionIndex(agI, n_tI);
        ss << pu->SoftPrintObservationHistory(agI, n_ohI) << " -> " <<
            pu->SoftPrintAction(agI, n_aI) << endl;

        Index n_ts = ts+1;
        if(n_ts  <= last_ts) // ts + 1 <= h - 1
        {
            RecursivelyPrintPolicyForAgent(
                pu, ss, agI, n_ts, last_ts, n_aohI, n_ohI, 
                n_tc, n_tI, n_aI, jpolBGVec, bgVec);
        }
        else
        {
#if DEBUG_RECURSIVE_SPRINT
            cout << "this is last stage, no further RecurivelyPrintPolicyForAgent"<<endl;
#endif
        }
    }
}